

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeHandleMovedCursor(VdbeCursor *p)

{
  BtCursor *pCur;
  int iVar1;
  byte bVar2;
  
  pCur = (p->uc).pCursor;
  bVar2 = pCur->eState;
  if (2 < bVar2) {
    iVar1 = btreeRestoreCursorPosition(pCur);
    if (iVar1 != 0) {
      p->cacheStatus = 0;
      goto LAB_0016ea1a;
    }
    bVar2 = pCur->eState;
  }
  p->cacheStatus = 0;
  iVar1 = 0;
  if (bVar2 == 0) {
    return 0;
  }
LAB_0016ea1a:
  p->nullRow = '\x01';
  return iVar1;
}

Assistant:

SQLITE_NOINLINE sqlite3VdbeHandleMovedCursor(VdbeCursor *p){
  int isDifferentRow, rc;
  assert( p->eCurType==CURTYPE_BTREE );
  assert( p->uc.pCursor!=0 );
  assert( sqlite3BtreeCursorHasMoved(p->uc.pCursor) );
  rc = sqlite3BtreeCursorRestore(p->uc.pCursor, &isDifferentRow);
  p->cacheStatus = CACHE_STALE;
  if( isDifferentRow ) p->nullRow = 1;
  return rc;
}